

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiclock.cpp
# Opt level: O0

int clock_in(void)

{
  bool bVar1;
  RtMidiIn *pRVar2;
  RtMidiError *error;
  string local_48 [5];
  char input;
  undefined4 local_14;
  RtMidiIn *pRStack_10;
  uint clock_count;
  RtMidiIn *midiin;
  
  pRStack_10 = (RtMidiIn *)0x0;
  local_14 = 0;
  pRVar2 = (RtMidiIn *)operator_new(0x10);
  error._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_48,"RtMidi Input Client",(allocator<char> *)((long)&error + 7));
  RtMidiIn::RtMidiIn(pRVar2,0,local_48);
  error._6_1_ = 0;
  pRStack_10 = pRVar2;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)((long)&error + 7));
  bVar1 = chooseInputPort(pRStack_10);
  if (bVar1) {
    RtMidiIn::setCallback(pRStack_10,mycallback,&local_14);
    RtMidiIn::ignoreTypes(pRStack_10,false,false,false);
    std::operator<<((ostream *)&std::cout,"\nReading MIDI input ... press <enter> to quit.\n");
    std::istream::get((char *)&std::cin);
  }
  if (pRStack_10 != (RtMidiIn *)0x0) {
    (**(code **)(*(long *)pRStack_10 + 0x40))();
  }
  return 0;
}

Assistant:

int clock_in()
{
  RtMidiIn *midiin = 0;
  unsigned int clock_count = 0;

  try {

    // RtMidiIn constructor
    midiin = new RtMidiIn();

    // Call function to select port.
    if ( chooseInputPort( midiin ) == false ) goto cleanup;

    // Set our callback function.  This should be done immediately after
    // opening the port to avoid having incoming messages written to the
    // queue instead of sent to the callback function.
    midiin->setCallback( &mycallback, &clock_count );

    // Don't ignore sysex, timing, or active sensing messages.
    midiin->ignoreTypes( false, false, false );

    std::cout << "\nReading MIDI input ... press <enter> to quit.\n";
    char input;
    std::cin.get(input);

  } catch ( RtMidiError &error ) {
    error.printMessage();
  }

 cleanup:

  delete midiin;

  return 0;
}